

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mulhdu(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 rh;
  TCGv_i64 arg1;
  uint32_t uVar1;
  TCGv_i64 rl;
  TCGv_i64 lo;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  rl = tcg_temp_new_i64(tcg_ctx_00);
  uVar1 = rD(ctx->opcode);
  rh = cpu_gpr[uVar1];
  uVar1 = rA(ctx->opcode);
  arg1 = cpu_gpr[uVar1];
  uVar1 = rB(ctx->opcode);
  tcg_gen_mulu2_i64_ppc64(tcg_ctx_00,rl,rh,arg1,cpu_gpr[uVar1]);
  tcg_temp_free_i64(tcg_ctx_00,rl);
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    uVar1 = rD(ctx->opcode);
    gen_set_Rc0(ctx,cpu_gpr[uVar1]);
  }
  return;
}

Assistant:

static void gen_mulhdu(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv lo = tcg_temp_new(tcg_ctx);
    tcg_gen_mulu2_tl(tcg_ctx, lo, cpu_gpr[rD(ctx->opcode)],
                     cpu_gpr[rA(ctx->opcode)], cpu_gpr[rB(ctx->opcode)]);
    tcg_temp_free(tcg_ctx, lo);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}